

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_raw_buffer_store_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  Value *pVVar4;
  Value *pVVar5;
  mapped_type *pmVar6;
  Type *this;
  LoggingCallback p_Var7;
  void *pvVar8;
  char local_1048 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Type *store_type;
  mapped_type *meta;
  CallInst *pCStack_20;
  Id ptr_id;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  meta._4_4_ = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  if ((*(int *)&instruction_local[9].super_Instruction.attachments._M_h._M_rehash_policy.field_0x4
       == 2) &&
     (pVVar4 = (Value *)instruction_local[8].super_Instruction.operands.
                        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
     pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2), pVVar4 == pVVar5))
  {
    *(Id *)((long)&instruction_local[6].super_Instruction.super_Value.tween_id + 4) = meta._4_4_;
    *(undefined4 *)&instruction_local[6].super_Instruction.is_terminator = 0x45;
    return true;
  }
  pmVar6 = std::
           unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
           ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                            _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
  if (pmVar6->storage == StorageClassPhysicalStorageBuffer) {
    bVar1 = emit_physical_buffer_store_instruction
                      ((Impl *)instruction_local,pCStack_20,&pmVar6->physical_pointer_meta,0);
    return bVar1;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,4);
  this = LLVMBC::Value::getType(pVVar4);
  TVar2 = LLVMBC::Type::getTypeID(this);
  if ((TVar2 != FloatTyID) &&
     (((TVar2 = LLVMBC::Type::getTypeID(this), TVar2 != IntegerTyID ||
       (uVar3 = LLVMBC::Type::getIntegerBitWidth(this), uVar3 != 0x20)) &&
      (pmVar6->storage != StorageClassStorageBuffer)))) {
    p_Var7 = get_thread_log_callback();
    if (p_Var7 == (LoggingCallback)0x0) {
      fprintf(_stderr,
              "[ERROR]: 16 or 64-bit RawBufferStore on descriptors is only supported for SSBOs.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1048,0x1000,
               "16 or 64-bit RawBufferStore on descriptors is only supported for SSBOs.\n");
      pvVar8 = get_thread_log_callback_userdata();
      (*p_Var7)(pvVar8,Error,local_1048);
    }
    return false;
  }
  bVar1 = emit_buffer_store_instruction((Impl *)instruction_local,pCStack_20);
  return bVar1;
}

Assistant:

bool emit_raw_buffer_store_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));

	// Deferred 64-bit atomic. Resolve in a later AGS atomic.
	if (impl.ags.num_instructions == 2 && impl.ags.backdoor_instructions[0] == instruction->getOperand(2))
	{
		impl.ags.active_uav_ptr = ptr_id;
		impl.ags.active_uav_op = DXIL::Op::BufferStore;
		return true;
	}

	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer)
	{
		auto *store_type = instruction->getOperand(4)->getType();
		if (store_type->getTypeID() != llvm::Type::TypeID::FloatTyID &&
		    !(store_type->getTypeID() == llvm::Type::TypeID::IntegerTyID && store_type->getIntegerBitWidth() == 32) &&
		    meta.storage != spv::StorageClassStorageBuffer)
		{
			LOGE("16 or 64-bit RawBufferStore on descriptors is only supported for SSBOs.\n");
			return false;
		}

		return emit_buffer_store_instruction(impl, instruction);
	}
	else
		return emit_physical_buffer_store_instruction(impl, instruction, meta.physical_pointer_meta);
}